

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseExprCastValueAndTrailingE(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  State *in_RDI;
  int *in_stack_00000010;
  State *in_stack_00000018;
  ParseState copy;
  ComplexityGuard guard;
  undefined8 uVar4;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar3) {
    bVar5 = 0;
  }
  else {
    uVar1 = (local_10->parse_state).mangled_idx;
    uVar2 = (local_10->parse_state).out_cur_idx;
    uVar4 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
    bVar3 = ParseNumber(in_stack_00000018,in_stack_00000010);
    if ((bVar3) &&
       (bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38)), bVar3)) {
      bVar5 = 1;
    }
    else {
      (local_10->parse_state).mangled_idx = uVar1;
      (local_10->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar4;
      bVar3 = ParseFloatNumber((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8
                                                ));
      if (bVar3) {
        bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
        if (bVar3) {
          bVar5 = 1;
          goto LAB_003b746d;
        }
        bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
        if (((bVar3) &&
            (bVar3 = ParseFloatNumber((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                        in_stack_fffffffffffffff8)), bVar3)) &&
           (bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38)), bVar3
           )) {
          bVar5 = 1;
          goto LAB_003b746d;
        }
      }
      (local_10->parse_state).mangled_idx = uVar1;
      (local_10->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar4;
      bVar5 = 0;
    }
  }
LAB_003b746d:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ParseExprCastValueAndTrailingE(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // We have to be able to backtrack after accepting a number because we could
  // have e.g. "7fffE", which will accept "7" as a number but then fail to find
  // the 'E'.
  ParseState copy = state->parse_state;
  if (ParseNumber(state, nullptr) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseFloatNumber(state)) {
    // <float> for ordinary floating-point types
    if (ParseOneCharToken(state, 'E')) return true;

    // <float> _ <float> for complex floating-point types
    if (ParseOneCharToken(state, '_') && ParseFloatNumber(state) &&
        ParseOneCharToken(state, 'E')) {
      return true;
    }
  }
  state->parse_state = copy;

  return false;
}